

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_parseIntegerLiteralTest_Test::
OpenDDLParserTest_parseIntegerLiteralTest_Test(OpenDDLParserTest_parseIntegerLiteralTest_Test *this)

{
  OpenDDLParserTest::OpenDDLParserTest(&this->super_OpenDDLParserTest);
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0017b850;
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseIntegerLiteralTest) {
    char *in(nullptr);
    size_t len1(0);
    Value *data(nullptr);

    char token1[] = "1", *end1(findEnd(token1, len1));
    in = OpenDDLParser::parseIntegerLiteral(token1, end1, &data);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_int32, data->m_type);
    EXPECT_EQ(1, data->getInt32());
    registerValueForDeletion(data);

    size_t len2(0);
    char token2[] = "aaa", *end2(findEnd(token2, len2));
    in = OpenDDLParser::parseIntegerLiteral(token2, end2, &data);
    EXPECT_EQ(nullptr, data);
}